

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O0

void Genetic::generate_population(void)

{
  int local_3c;
  pair<Solution_*,_double> local_38;
  int local_28;
  int local_24;
  int i;
  Solution *local_10;
  Solution *solution;
  
  local_10 = Hillclimbing::run(10000);
  local_24 = 0;
  std::pair<Solution_*,_double>::pair<Solution_*&,_int,_true>
            ((pair<Solution_*,_double> *)&i,&local_10,&local_24);
  std::__cxx11::list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
  ::push_back(&solutions_abi_cxx11_,(value_type *)&i);
  for (local_28 = 1; local_28 < population_limit; local_28 = local_28 + 1) {
    local_10 = Utils::random_solution();
    if (max_weight < local_10->weight) {
      max_weight = local_10->weight;
    }
    local_3c = 0;
    std::pair<Solution_*,_double>::pair<Solution_*&,_int,_true>(&local_38,&local_10,&local_3c);
    std::__cxx11::
    list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::push_back
              (&solutions_abi_cxx11_,&local_38);
  }
  max_weight = max_weight * 2.0;
  return;
}

Assistant:

void Genetic::generate_population()
{
	//std::cout << "Generating population\n";
	//The first solution is the best that hillclimbing can get	
	auto solution = Hillclimbing::run();
	//auto solution = Utils::random_solution();

	solutions.push_back(std::pair<Solution*, double>(solution, 0));
	for (int i = 1; i < population_limit; ++i)
	{
		solution = Utils::random_solution();

		if (solution->weight > max_weight)
			max_weight = solution->weight;

		solutions.push_back(std::pair<Solution*, double>(solution, 0));
	}
	//ticket_max = pow(ticket_max, 2); // to much
	max_weight *= 2;
	//std::cout << "Initial solutions calculated\n";
}